

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.h
# Opt level: O0

void llvm::format_provider<llvm::dwarf::Attribute,_void>::format
               (Attribute *E,raw_ostream *OS,StringRef Style)

{
  bool bVar1;
  raw_ostream *prVar2;
  format_object<llvm::dwarf::Attribute> local_50;
  undefined1 local_38 [8];
  StringRef Str;
  raw_ostream *OS_local;
  Attribute *E_local;
  StringRef Style_local;
  
  Str.Length = (size_t)OS;
  _local_38 = dwarf::AttributeString((uint)*E);
  bVar1 = StringRef::empty((StringRef *)local_38);
  if (bVar1) {
    prVar2 = raw_ostream::operator<<((raw_ostream *)Str.Length,"DW_");
    prVar2 = raw_ostream::operator<<(prVar2,"AT");
    prVar2 = raw_ostream::operator<<(prVar2,"_unknown_");
    format<llvm::dwarf::Attribute>(&local_50,"%x",E);
    raw_ostream::operator<<(prVar2,&local_50.super_format_object_base);
  }
  else {
    raw_ostream::operator<<((raw_ostream *)Str.Length,_local_38);
  }
  return;
}

Assistant:

static void format(const Enum &E, raw_ostream &OS, StringRef Style) {
    StringRef Str = dwarf::EnumTraits<Enum>::StringFn(E);
    if (Str.empty()) {
      OS << "DW_" << dwarf::EnumTraits<Enum>::Type << "_unknown_"
         << llvm::format("%x", E);
    } else
      OS << Str;
  }